

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBAnalyzerResults.cpp
# Opt level: O3

void __thiscall
USBAnalyzerResults::GenerateExportFileSignals
          (USBAnalyzerResults *this,char *file,DisplayBase display_base)

{
  char cVar1;
  uint uVar2;
  ulonglong uVar3;
  size_t sVar4;
  ostream *poVar5;
  char *pcVar6;
  ulonglong uVar7;
  Frame f;
  ofstream file_stream;
  char time_str [128];
  ulonglong local_318;
  long lStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined2 local_2f8;
  double local_2f0;
  ulonglong local_2e8;
  Frame local_2e0;
  undefined7 uStack_2df;
  long lStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined2 local_2c0;
  long local_2b8;
  filebuf local_2b0 [240];
  ios_base local_1c0 [264];
  char local_b8 [136];
  
  std::ofstream::ofstream(&local_2b8,file,_S_out);
  local_2e8 = Analyzer::GetTriggerSample();
  uVar2 = Analyzer::GetSampleRate();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2b8,"Time [s],Signal,Duration [ns]",0x1d);
  std::ios::widen((char)(ostream *)&local_2b8 + (char)*(undefined8 *)(local_2b8 + -0x18));
  std::ostream::put((char)&local_2b8);
  std::ostream::flush();
  Frame::Frame((Frame *)&local_318);
  local_b8[0] = '\0';
  uVar3 = AnalyzerResults::GetNumFrames();
  if (uVar3 != 0) {
    local_2f0 = (double)uVar2 / 1000000000.0;
    uVar7 = 0;
    do {
      AnalyzerResults::GetFrame((ulonglong)&local_2e0);
      local_2f8 = local_2c0;
      local_318 = CONCAT71(uStack_2df,local_2e0);
      local_308 = local_2d0;
      uStack_300 = uStack_2c8;
      lStack_310 = lStack_2d8;
      Frame::~Frame(&local_2e0);
      cVar1 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar7);
      if (cVar1 != '\0') goto LAB_001323b7;
      AnalyzerHelpers::GetTimeString(local_318,local_2e8,uVar2,local_b8,0x80);
      sVar4 = strlen(local_b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,local_b8,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,",",1);
      if ((char)local_2f8 == '\0') {
        pcVar6 = "SE0";
        switch(local_308) {
        case 0:
          local_2e0 = (Frame)0x4b;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_2b8,(char *)&local_2e0,1);
          break;
        case 1:
          local_2e0 = (Frame)0x4a;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_2b8,(char *)&local_2e0,1);
          break;
        case 3:
          pcVar6 = "SE1";
        case 2:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,pcVar6,3);
        }
        local_2e0 = (Frame)0x2c;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2b8,(char *)&local_2e0,1);
        poVar5 = std::ostream::_M_insert<double>((double)(long)(lStack_310 - local_318) / local_2f0)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
      }
      uVar7 = uVar7 + 1;
    } while (uVar3 != uVar7);
  }
  AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar3);
LAB_001323b7:
  Frame::~Frame((Frame *)&local_318);
  local_2b8 = _VTT;
  *(undefined8 *)(local_2b0 + *(long *)(_VTT + -0x18) + -8) = __Frame;
  std::filebuf::~filebuf(local_2b0);
  std::ios_base::~ios_base(local_1c0);
  return;
}

Assistant:

void USBAnalyzerResults::GenerateExportFileSignals( const char* file, DisplayBase display_base )
{
    std::ofstream file_stream( file, std::ios::out );

    U64 trigger_sample = mAnalyzer->GetTriggerSample();
    U32 sample_rate = mAnalyzer->GetSampleRate();

    // header
    file_stream << "Time [s],Signal,Duration [ns]" << std::endl;

    Frame f;
    char time_str[ 128 ];
    time_str[ 0 ] = '\0';
    const U64 num_frames = GetNumFrames();
    for( U64 fcnt = 0; fcnt < num_frames; fcnt++ )
    {
        // get the frame
        f = GetFrame( fcnt );

        if( UpdateExportProgressAndCheckForCancel( fcnt, num_frames ) )
            return;

        // make the time string
        AnalyzerHelpers::GetTimeString( f.mStartingSampleInclusive, trigger_sample, sample_rate, time_str, sizeof( time_str ) );

        // output timestamp
        file_stream << time_str << ",";

        // start of a new packet?
        if( f.mType == FT_Signal )
        {
            if( f.mData1 == S_J )
                file_stream << 'J';
            else if( f.mData1 == S_K )
                file_stream << 'K';
            else if( f.mData1 == S_SE0 )
                file_stream << "SE0";
            else if( f.mData1 == S_SE1 )
                file_stream << "SE1";

            file_stream << ',' << ( f.mEndingSampleInclusive - f.mStartingSampleInclusive ) / ( sample_rate / 1e9 ) << std::endl;
        }
    }

    // end
    UpdateExportProgressAndCheckForCancel( num_frames, num_frames );
}